

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void __thiscall ExampleAppConsole::ExampleAppConsole(ExampleAppConsole *this)

{
  char *local_40;
  char *local_38;
  char *local_30;
  char *local_28 [3];
  ExampleAppConsole *local_10;
  ExampleAppConsole *this_local;
  
  local_10 = this;
  ImVector<char_*>::ImVector(&this->Items);
  ImVector<const_char_*>::ImVector(&this->Commands);
  ImVector<char_*>::ImVector(&this->History);
  ImGuiTextFilter::ImGuiTextFilter(&this->Filter,"");
  ClearLog(this);
  this->InputBuf[0xf0] = '\0';
  this->InputBuf[0xf1] = '\0';
  this->InputBuf[0xf2] = '\0';
  this->InputBuf[0xf3] = '\0';
  this->InputBuf[0xf4] = '\0';
  this->InputBuf[0xf5] = '\0';
  this->InputBuf[0xf6] = '\0';
  this->InputBuf[0xf7] = '\0';
  this->InputBuf[0xf8] = '\0';
  this->InputBuf[0xf9] = '\0';
  this->InputBuf[0xfa] = '\0';
  this->InputBuf[0xfb] = '\0';
  this->InputBuf[0xfc] = '\0';
  this->InputBuf[0xfd] = '\0';
  this->InputBuf[0xfe] = '\0';
  this->InputBuf[0xff] = '\0';
  this->InputBuf[0xe0] = '\0';
  this->InputBuf[0xe1] = '\0';
  this->InputBuf[0xe2] = '\0';
  this->InputBuf[0xe3] = '\0';
  this->InputBuf[0xe4] = '\0';
  this->InputBuf[0xe5] = '\0';
  this->InputBuf[0xe6] = '\0';
  this->InputBuf[0xe7] = '\0';
  this->InputBuf[0xe8] = '\0';
  this->InputBuf[0xe9] = '\0';
  this->InputBuf[0xea] = '\0';
  this->InputBuf[0xeb] = '\0';
  this->InputBuf[0xec] = '\0';
  this->InputBuf[0xed] = '\0';
  this->InputBuf[0xee] = '\0';
  this->InputBuf[0xef] = '\0';
  this->InputBuf[0xd0] = '\0';
  this->InputBuf[0xd1] = '\0';
  this->InputBuf[0xd2] = '\0';
  this->InputBuf[0xd3] = '\0';
  this->InputBuf[0xd4] = '\0';
  this->InputBuf[0xd5] = '\0';
  this->InputBuf[0xd6] = '\0';
  this->InputBuf[0xd7] = '\0';
  this->InputBuf[0xd8] = '\0';
  this->InputBuf[0xd9] = '\0';
  this->InputBuf[0xda] = '\0';
  this->InputBuf[0xdb] = '\0';
  this->InputBuf[0xdc] = '\0';
  this->InputBuf[0xdd] = '\0';
  this->InputBuf[0xde] = '\0';
  this->InputBuf[0xdf] = '\0';
  this->InputBuf[0xc0] = '\0';
  this->InputBuf[0xc1] = '\0';
  this->InputBuf[0xc2] = '\0';
  this->InputBuf[0xc3] = '\0';
  this->InputBuf[0xc4] = '\0';
  this->InputBuf[0xc5] = '\0';
  this->InputBuf[0xc6] = '\0';
  this->InputBuf[199] = '\0';
  this->InputBuf[200] = '\0';
  this->InputBuf[0xc9] = '\0';
  this->InputBuf[0xca] = '\0';
  this->InputBuf[0xcb] = '\0';
  this->InputBuf[0xcc] = '\0';
  this->InputBuf[0xcd] = '\0';
  this->InputBuf[0xce] = '\0';
  this->InputBuf[0xcf] = '\0';
  this->InputBuf[0xb0] = '\0';
  this->InputBuf[0xb1] = '\0';
  this->InputBuf[0xb2] = '\0';
  this->InputBuf[0xb3] = '\0';
  this->InputBuf[0xb4] = '\0';
  this->InputBuf[0xb5] = '\0';
  this->InputBuf[0xb6] = '\0';
  this->InputBuf[0xb7] = '\0';
  this->InputBuf[0xb8] = '\0';
  this->InputBuf[0xb9] = '\0';
  this->InputBuf[0xba] = '\0';
  this->InputBuf[0xbb] = '\0';
  this->InputBuf[0xbc] = '\0';
  this->InputBuf[0xbd] = '\0';
  this->InputBuf[0xbe] = '\0';
  this->InputBuf[0xbf] = '\0';
  this->InputBuf[0xa0] = '\0';
  this->InputBuf[0xa1] = '\0';
  this->InputBuf[0xa2] = '\0';
  this->InputBuf[0xa3] = '\0';
  this->InputBuf[0xa4] = '\0';
  this->InputBuf[0xa5] = '\0';
  this->InputBuf[0xa6] = '\0';
  this->InputBuf[0xa7] = '\0';
  this->InputBuf[0xa8] = '\0';
  this->InputBuf[0xa9] = '\0';
  this->InputBuf[0xaa] = '\0';
  this->InputBuf[0xab] = '\0';
  this->InputBuf[0xac] = '\0';
  this->InputBuf[0xad] = '\0';
  this->InputBuf[0xae] = '\0';
  this->InputBuf[0xaf] = '\0';
  this->InputBuf[0x90] = '\0';
  this->InputBuf[0x91] = '\0';
  this->InputBuf[0x92] = '\0';
  this->InputBuf[0x93] = '\0';
  this->InputBuf[0x94] = '\0';
  this->InputBuf[0x95] = '\0';
  this->InputBuf[0x96] = '\0';
  this->InputBuf[0x97] = '\0';
  this->InputBuf[0x98] = '\0';
  this->InputBuf[0x99] = '\0';
  this->InputBuf[0x9a] = '\0';
  this->InputBuf[0x9b] = '\0';
  this->InputBuf[0x9c] = '\0';
  this->InputBuf[0x9d] = '\0';
  this->InputBuf[0x9e] = '\0';
  this->InputBuf[0x9f] = '\0';
  this->InputBuf[0x80] = '\0';
  this->InputBuf[0x81] = '\0';
  this->InputBuf[0x82] = '\0';
  this->InputBuf[0x83] = '\0';
  this->InputBuf[0x84] = '\0';
  this->InputBuf[0x85] = '\0';
  this->InputBuf[0x86] = '\0';
  this->InputBuf[0x87] = '\0';
  this->InputBuf[0x88] = '\0';
  this->InputBuf[0x89] = '\0';
  this->InputBuf[0x8a] = '\0';
  this->InputBuf[0x8b] = '\0';
  this->InputBuf[0x8c] = '\0';
  this->InputBuf[0x8d] = '\0';
  this->InputBuf[0x8e] = '\0';
  this->InputBuf[0x8f] = '\0';
  this->InputBuf[0x70] = '\0';
  this->InputBuf[0x71] = '\0';
  this->InputBuf[0x72] = '\0';
  this->InputBuf[0x73] = '\0';
  this->InputBuf[0x74] = '\0';
  this->InputBuf[0x75] = '\0';
  this->InputBuf[0x76] = '\0';
  this->InputBuf[0x77] = '\0';
  this->InputBuf[0x78] = '\0';
  this->InputBuf[0x79] = '\0';
  this->InputBuf[0x7a] = '\0';
  this->InputBuf[0x7b] = '\0';
  this->InputBuf[0x7c] = '\0';
  this->InputBuf[0x7d] = '\0';
  this->InputBuf[0x7e] = '\0';
  this->InputBuf[0x7f] = '\0';
  this->InputBuf[0x60] = '\0';
  this->InputBuf[0x61] = '\0';
  this->InputBuf[0x62] = '\0';
  this->InputBuf[99] = '\0';
  this->InputBuf[100] = '\0';
  this->InputBuf[0x65] = '\0';
  this->InputBuf[0x66] = '\0';
  this->InputBuf[0x67] = '\0';
  this->InputBuf[0x68] = '\0';
  this->InputBuf[0x69] = '\0';
  this->InputBuf[0x6a] = '\0';
  this->InputBuf[0x6b] = '\0';
  this->InputBuf[0x6c] = '\0';
  this->InputBuf[0x6d] = '\0';
  this->InputBuf[0x6e] = '\0';
  this->InputBuf[0x6f] = '\0';
  this->InputBuf[0x50] = '\0';
  this->InputBuf[0x51] = '\0';
  this->InputBuf[0x52] = '\0';
  this->InputBuf[0x53] = '\0';
  this->InputBuf[0x54] = '\0';
  this->InputBuf[0x55] = '\0';
  this->InputBuf[0x56] = '\0';
  this->InputBuf[0x57] = '\0';
  this->InputBuf[0x58] = '\0';
  this->InputBuf[0x59] = '\0';
  this->InputBuf[0x5a] = '\0';
  this->InputBuf[0x5b] = '\0';
  this->InputBuf[0x5c] = '\0';
  this->InputBuf[0x5d] = '\0';
  this->InputBuf[0x5e] = '\0';
  this->InputBuf[0x5f] = '\0';
  this->InputBuf[0x40] = '\0';
  this->InputBuf[0x41] = '\0';
  this->InputBuf[0x42] = '\0';
  this->InputBuf[0x43] = '\0';
  this->InputBuf[0x44] = '\0';
  this->InputBuf[0x45] = '\0';
  this->InputBuf[0x46] = '\0';
  this->InputBuf[0x47] = '\0';
  this->InputBuf[0x48] = '\0';
  this->InputBuf[0x49] = '\0';
  this->InputBuf[0x4a] = '\0';
  this->InputBuf[0x4b] = '\0';
  this->InputBuf[0x4c] = '\0';
  this->InputBuf[0x4d] = '\0';
  this->InputBuf[0x4e] = '\0';
  this->InputBuf[0x4f] = '\0';
  this->InputBuf[0x30] = '\0';
  this->InputBuf[0x31] = '\0';
  this->InputBuf[0x32] = '\0';
  this->InputBuf[0x33] = '\0';
  this->InputBuf[0x34] = '\0';
  this->InputBuf[0x35] = '\0';
  this->InputBuf[0x36] = '\0';
  this->InputBuf[0x37] = '\0';
  this->InputBuf[0x38] = '\0';
  this->InputBuf[0x39] = '\0';
  this->InputBuf[0x3a] = '\0';
  this->InputBuf[0x3b] = '\0';
  this->InputBuf[0x3c] = '\0';
  this->InputBuf[0x3d] = '\0';
  this->InputBuf[0x3e] = '\0';
  this->InputBuf[0x3f] = '\0';
  this->InputBuf[0x20] = '\0';
  this->InputBuf[0x21] = '\0';
  this->InputBuf[0x22] = '\0';
  this->InputBuf[0x23] = '\0';
  this->InputBuf[0x24] = '\0';
  this->InputBuf[0x25] = '\0';
  this->InputBuf[0x26] = '\0';
  this->InputBuf[0x27] = '\0';
  this->InputBuf[0x28] = '\0';
  this->InputBuf[0x29] = '\0';
  this->InputBuf[0x2a] = '\0';
  this->InputBuf[0x2b] = '\0';
  this->InputBuf[0x2c] = '\0';
  this->InputBuf[0x2d] = '\0';
  this->InputBuf[0x2e] = '\0';
  this->InputBuf[0x2f] = '\0';
  this->InputBuf[0x10] = '\0';
  this->InputBuf[0x11] = '\0';
  this->InputBuf[0x12] = '\0';
  this->InputBuf[0x13] = '\0';
  this->InputBuf[0x14] = '\0';
  this->InputBuf[0x15] = '\0';
  this->InputBuf[0x16] = '\0';
  this->InputBuf[0x17] = '\0';
  this->InputBuf[0x18] = '\0';
  this->InputBuf[0x19] = '\0';
  this->InputBuf[0x1a] = '\0';
  this->InputBuf[0x1b] = '\0';
  this->InputBuf[0x1c] = '\0';
  this->InputBuf[0x1d] = '\0';
  this->InputBuf[0x1e] = '\0';
  this->InputBuf[0x1f] = '\0';
  this->InputBuf[0] = '\0';
  this->InputBuf[1] = '\0';
  this->InputBuf[2] = '\0';
  this->InputBuf[3] = '\0';
  this->InputBuf[4] = '\0';
  this->InputBuf[5] = '\0';
  this->InputBuf[6] = '\0';
  this->InputBuf[7] = '\0';
  this->InputBuf[8] = '\0';
  this->InputBuf[9] = '\0';
  this->InputBuf[10] = '\0';
  this->InputBuf[0xb] = '\0';
  this->InputBuf[0xc] = '\0';
  this->InputBuf[0xd] = '\0';
  this->InputBuf[0xe] = '\0';
  this->InputBuf[0xf] = '\0';
  this->HistoryPos = -1;
  local_28[0] = "HELP";
  ImVector<const_char_*>::push_back(&this->Commands,local_28);
  local_30 = "HISTORY";
  ImVector<const_char_*>::push_back(&this->Commands,&local_30);
  local_38 = "CLEAR";
  ImVector<const_char_*>::push_back(&this->Commands,&local_38);
  local_40 = "CLASSIFY";
  ImVector<const_char_*>::push_back(&this->Commands,&local_40);
  this->AutoScroll = true;
  this->ScrollToBottom = false;
  AddLog(this,"Welcome to Dear ImGui!");
  return;
}

Assistant:

ExampleAppConsole()
    {
        ClearLog();
        memset(InputBuf, 0, sizeof(InputBuf));
        HistoryPos = -1;

        // "CLASSIFY" is here to provide the test case where "C"+[tab] completes to "CL" and display multiple matches.
        Commands.push_back("HELP");
        Commands.push_back("HISTORY");
        Commands.push_back("CLEAR");
        Commands.push_back("CLASSIFY");
        AutoScroll = true;
        ScrollToBottom = false;
        AddLog("Welcome to Dear ImGui!");
    }